

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void doctest::detail::logAssert
               (bool passed,char *decomposition,bool threw,char *expr,Enum assert_type,char *file,
               int line)

{
  Code code;
  char *pcVar1;
  undefined7 in_register_00000039;
  Color *this;
  Color col;
  String local_1488;
  String local_1480;
  String local_1478;
  String local_1470;
  String local_1468;
  String local_1460;
  String local_1458;
  String local_1450;
  String local_1448;
  String local_1440;
  char msg [1024];
  char info3 [1024];
  char info2 [1024];
  char info1 [1024];
  char loc [1024];
  
  pcVar1 = fileForOutput(file);
  snprintf(loc,0x400,"%s(%d)",pcVar1,(ulong)(uint)line);
  if ((int)CONCAT71(in_register_00000039,passed) == 0) {
    pcVar1 = "";
    if (threw) {
      pcVar1 = "(threw exception)";
    }
    snprintf(msg,0x400," FAILED! %s\n",pcVar1);
  }
  else {
    builtin_strncpy(msg," PASSED!\n",10);
  }
  pcVar1 = getAssertString(assert_type);
  this = (Color *)info1;
  snprintf((char *)this,0x400,"  %s( %s )\n",pcVar1,expr);
  info2._0_4_ = info2._0_4_ & 0xffffff00;
  info3[0] = '\0';
  if (!threw) {
    builtin_strncpy(info2,"with expansion:\n",0x11);
    this = (Color *)info3;
    snprintf((char *)this,0x400,"  %s( %s )\n",pcVar1,decomposition);
  }
  if (loc[0] != '\0') {
    Color::use(this,LightGrey);
    printf("%s");
    this = &col;
    Color::~Color(this);
  }
  if (msg[0] != '\0') {
    code = Red;
    if (passed) {
      code = BrightGreen;
    }
    Color::use(this,code);
    printf("%s");
    this = &col;
    Color::~Color(this);
  }
  if (info1[0] != '\0') {
    Color::use(this,Cyan);
    printf("%s");
    this = &col;
    Color::~Color(this);
  }
  if (!threw) {
    Color::use(this,None);
    printf("%s");
    this = &col;
    Color::~Color(this);
  }
  if (info3[0] != '\0') {
    Color::use(this,Cyan);
    printf("%s");
    this = &col;
    Color::~Color(this);
  }
  Color::use(this,None);
  putchar(10);
  Color::~Color(&col);
  String::String(&local_1478,loc);
  String::String(&local_1480,msg);
  String::operator+(&local_1470,&local_1478);
  String::String(&local_1488,info1);
  String::operator+(&local_1468,&local_1470);
  String::String(&local_1450,info2);
  String::operator+(&local_1448,&local_1468);
  String::String(&local_1458,info3);
  String::operator+(&local_1440,&local_1448);
  String::String(&local_1460,"\n");
  String::operator+((String *)&col,&local_1440);
  free(_col);
  free(local_1460.m_str);
  free(local_1440.m_str);
  free(local_1458.m_str);
  free(local_1448.m_str);
  free(local_1450.m_str);
  free(local_1468.m_str);
  free(local_1488.m_str);
  free(local_1470.m_str);
  free(local_1480.m_str);
  free(local_1478.m_str);
  return;
}

Assistant:

void logAssert(bool passed, const char* decomposition, bool threw, const char* expr,
                   assertType::Enum assert_type, const char* file, int line) {
        char loc[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        DOCTEST_SNPRINTF(loc, DOCTEST_COUNTOF(loc), "%s(%d)", fileForOutput(file), line);

        char msg[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        if(passed)
            DOCTEST_SNPRINTF(msg, DOCTEST_COUNTOF(msg), " PASSED!\n");
        else
            DOCTEST_SNPRINTF(msg, DOCTEST_COUNTOF(msg), " FAILED! %s\n",
                             (threw ? "(threw exception)" : ""));

        char info1[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        DOCTEST_SNPRINTF(info1, DOCTEST_COUNTOF(info1), "  %s( %s )\n",
                         getAssertString(assert_type), expr);

        char info2[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        char info3[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        info2[0] = 0;
        info3[0] = 0;
        if(!threw) {
            DOCTEST_SNPRINTF(info2, DOCTEST_COUNTOF(info2), "with expansion:\n");
            DOCTEST_SNPRINTF(info3, DOCTEST_COUNTOF(info3), "  %s( %s )\n",
                             getAssertString(assert_type), decomposition);
        }

        DOCTEST_PRINTF_COLORED(loc, Color::LightGrey);
        DOCTEST_PRINTF_COLORED(msg, passed ? Color::BrightGreen : Color::Red);
        DOCTEST_PRINTF_COLORED(info1, Color::Cyan);
        DOCTEST_PRINTF_COLORED(info2, Color::None);
        DOCTEST_PRINTF_COLORED(info3, Color::Cyan);
        DOCTEST_PRINTF_COLORED("\n", Color::None);

        printToDebugConsole(String(loc) + msg + info1 + info2 + info3 + "\n");
    }